

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextBase.hpp
# Opt level: O0

void __thiscall
Diligent::DeviceContextBase<Diligent::EngineVkImplTraits>::DispatchCompute
          (DeviceContextBase<Diligent::EngineVkImplTraits> *this,DispatchComputeAttribs *Attribs,
          int param_2)

{
  bool bVar1;
  PipelineStateVkImpl *pPVar2;
  PipelineStateDesc *pPVar3;
  Char *pCVar4;
  RenderPassVkImpl *pRVar5;
  char (*in_R8) [29];
  undefined1 local_b0 [8];
  string msg_3;
  string msg_2;
  string msg_1;
  undefined1 local_40 [8];
  string msg;
  int param_2_local;
  DispatchComputeAttribs *Attribs_local;
  DeviceContextBase<Diligent::EngineVkImplTraits> *this_local;
  
  msg.field_2._12_4_ = param_2;
  bVar1 = RefCntAutoPtr<Diligent::PipelineStateVkImpl>::operator!(&this->m_pPipelineState);
  if (bVar1) {
    FormatString<char[75]>
              ((string *)local_40,
               (char (*) [75])
               "DispatchCompute command arguments are invalid: no pipeline state is bound.");
    pCVar4 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar4,"DispatchCompute",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
               ,0xa16);
    std::__cxx11::string::~string((string *)local_40);
  }
  pPVar2 = RefCntAutoPtr<Diligent::PipelineStateVkImpl>::operator->(&this->m_pPipelineState);
  pPVar3 = PipelineStateBase<Diligent::EngineVkImplTraits>::GetDesc
                     (&pPVar2->super_PipelineStateBase<Diligent::EngineVkImplTraits>);
  if (pPVar3->PipelineType != PIPELINE_TYPE_COMPUTE) {
    pPVar2 = RefCntAutoPtr<Diligent::PipelineStateVkImpl>::operator->(&this->m_pPipelineState);
    pPVar3 = PipelineStateBase<Diligent::EngineVkImplTraits>::GetDesc
                       (&pPVar2->super_PipelineStateBase<Diligent::EngineVkImplTraits>);
    FormatString<char[64],char_const*,char[29]>
              ((string *)((long)&msg_2.field_2 + 8),
               (Diligent *)"DispatchCompute command arguments are invalid: pipeline state \'",
               (char (*) [64])pPVar3,(char **)"\' is not a compute pipeline.",in_R8);
    pCVar4 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar4,"DispatchCompute",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
               ,0xa1a);
    std::__cxx11::string::~string((string *)(msg_2.field_2._M_local_buf + 8));
  }
  pRVar5 = Diligent::RefCntAutoPtr::operator_cast_to_RenderPassVkImpl_
                     ((RefCntAutoPtr *)&this->m_pActiveRenderPass);
  if (pRVar5 != (RenderPassVkImpl *)0x0) {
    FormatString<char[65]>
              ((string *)((long)&msg_3.field_2 + 8),
               (char (*) [65])"DispatchCompute command must be performed outside of render pass");
    pCVar4 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar4,"DispatchCompute",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
               ,0xa1d);
    std::__cxx11::string::~string((string *)(msg_3.field_2._M_local_buf + 8));
  }
  bVar1 = VerifyDispatchComputeAttribs(Attribs);
  if (!bVar1) {
    FormatString<char[31]>((string *)local_b0,(char (*) [31])"DispatchComputeAttribs attribs");
    pCVar4 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar4,"DispatchCompute",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
               ,0xa1f);
    std::__cxx11::string::~string((string *)local_b0);
  }
  (this->m_Stats).CommandCounters.DispatchCompute =
       (this->m_Stats).CommandCounters.DispatchCompute + 1;
  return;
}

Assistant:

inline void DeviceContextBase<ImplementationTraits>::DispatchCompute(const DispatchComputeAttribs& Attribs, int)
{
    DEV_CHECK_ERR(m_pPipelineState, "DispatchCompute command arguments are invalid: no pipeline state is bound.");

    DEV_CHECK_ERR(m_pPipelineState->GetDesc().PipelineType == PIPELINE_TYPE_COMPUTE,
                  "DispatchCompute command arguments are invalid: pipeline state '", m_pPipelineState->GetDesc().Name,
                  "' is not a compute pipeline.");

    DEV_CHECK_ERR(m_pActiveRenderPass == nullptr,
                  "DispatchCompute command must be performed outside of render pass");

    DEV_CHECK_ERR(VerifyDispatchComputeAttribs(Attribs), "DispatchComputeAttribs attribs");

    ++m_Stats.CommandCounters.DispatchCompute;
}